

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# split.cpp
# Opt level: O0

int __thiscall
ncnn::Split::forward
          (Split *this,vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *bottom_blobs,
          vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *top_blobs,Option *param_4)

{
  const_reference pvVar1;
  Mat *pMVar2;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *in_RDX;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *in_RSI;
  size_t i;
  Mat *bottom_blob;
  const_reference m;
  Mat *this_00;
  Mat *local_30;
  
  pvVar1 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](in_RSI,0);
  local_30 = (Mat *)0x0;
  while( true ) {
    this_00 = local_30;
    pMVar2 = (Mat *)std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::size(in_RDX);
    if (pMVar2 <= this_00) break;
    m = pvVar1;
    std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](in_RDX,(size_type)local_30);
    Mat::operator=(this_00,m);
    local_30 = (Mat *)((long)&local_30->data + 1);
  }
  return 0;
}

Assistant:

int Split::forward(const std::vector<Mat>& bottom_blobs, std::vector<Mat>& top_blobs, const Option& /*opt*/) const
{
    const Mat& bottom_blob = bottom_blobs[0];
    for (size_t i = 0; i < top_blobs.size(); i++)
    {
        top_blobs[i] = bottom_blob;
    }

    return 0;
}